

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.h
# Opt level: O2

void __thiscall runner::operator()(runner *this)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = std::operator!=(&this->command_,"none");
  if (bVar1) {
    iVar2 = system((this->command_)._M_dataplus._M_p);
    run_ok = iVar2 == 0;
    cppcms::service::shutdown();
    return;
  }
  return;
}

Assistant:

void operator()() const
	{
		if(command_ != "none") {
			run_ok = ::system(command_.c_str()) == 0;
			srv_->shutdown();	
		}
	}